

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Server::~Server(Server *this)

{
  this->_vptr_Server = (_func_int **)&PTR__Server_001bf308;
  std::_Function_base::~_Function_base(&(this->header_writer_).super__Function_base);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->default_headers_)._M_t);
  std::_Function_base::~_Function_base(&(this->socket_options_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->logger_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->expect_100_continue_handler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->post_routing_handler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->pre_routing_handler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->exception_handler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->error_handler_).super__Function_base);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->options_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->delete_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->delete_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->patch_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->patch_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->put_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->put_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->post_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->post_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->get_handlers_);
  std::_Function_base::~_Function_base(&(this->file_request_handler_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->default_file_mimetype_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->file_extension_and_mimetype_map_)._M_t);
  std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
  ~vector(&this->base_dirs_);
  std::_Function_base::~_Function_base(&(this->new_task_queue).super__Function_base);
  return;
}

Assistant:

inline Server::~Server() {}